

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.cc
# Opt level: O3

Symbol * __thiscall
sentencepiece::bpe::Trainer::GetPairSymbol(Trainer *this,Symbol *left,Symbol *right)

{
  flat_hash_map<uint64_t,_Symbol_*> *pfVar1;
  pointer *pppSVar2;
  pointer puVar3;
  iterator __position;
  Trainer *pTVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  iterator iVar8;
  ostream *poVar9;
  _Rb_tree_header *p_Var10;
  ulong uVar11;
  Symbol *pSVar12;
  ulong uVar13;
  pointer puVar14;
  Symbol *s;
  UnicodeText ut;
  uint64 fp;
  Symbol *local_70;
  UnicodeText local_68;
  flat_hash_map<uint64_t,_Symbol_*> *local_48;
  Trainer *local_40;
  uint64_t local_38;
  
  if (((right == (Symbol *)0x0 || left == (Symbol *)0x0) || (left->is_unk != false)) ||
     (right->is_unk != false)) {
    pSVar12 = (Symbol *)0x0;
  }
  else {
    uVar7 = right->fp;
    uVar6 = uVar7 >> 0x2b ^ (left->fp - uVar7) + 0x1f73e299748a907e;
    uVar11 = uVar6 << 9 ^ (-0x1f73e299748a907e - uVar7) - uVar6;
    uVar13 = uVar11 >> 8 ^ (uVar7 - uVar6) - uVar11;
    uVar6 = uVar13 >> 0x26 ^ (uVar6 - uVar11) - uVar13;
    uVar7 = uVar6 << 0x17 ^ (uVar11 - uVar13) - uVar6;
    uVar11 = uVar7 >> 5 ^ (uVar13 - uVar6) - uVar7;
    uVar13 = uVar11 >> 0x23 ^ (uVar6 - uVar7) - uVar11;
    uVar6 = uVar13 << 0x31 ^ (uVar7 - uVar11) - uVar13;
    uVar7 = uVar6 >> 0xb ^ (uVar11 - uVar13) - uVar6;
    uVar11 = uVar7 >> 0xc ^ (uVar13 - uVar6) - uVar7;
    uVar6 = uVar11 << 0x12 ^ (uVar6 - uVar7) - uVar11;
    local_38 = uVar6 >> 0x16 ^ uVar7 - (uVar11 + uVar6);
    pfVar1 = &this->symbols_cache_;
    iVar8 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_std::allocator<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&pfVar1->_M_h,&local_38);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
        ._M_cur == (__node_type *)0x0) {
      if ((left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_68.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bpe_model_trainer.cc",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x40);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!left->chars.empty()",0x14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
        error::Die::~Die((Die *)&local_68);
      }
      if ((right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_68.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bpe_model_trainer.cc",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x41);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!right->chars.empty()",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
        error::Die::~Die((Die *)&local_68);
      }
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      puVar14 = (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (left->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish;
      local_48 = pfVar1;
      local_40 = this;
      if (puVar14 != puVar3) {
        do {
          local_70 = (Symbol *)CONCAT44(local_70._4_4_,*puVar14);
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_70);
          }
          else {
            *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *puVar14;
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar14 = puVar14 + 1;
        } while (puVar14 != puVar3);
      }
      puVar14 = (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (right->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar14 != puVar3) {
        do {
          local_70 = (Symbol *)CONCAT44(local_70._4_4_,*puVar14);
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_70);
          }
          else {
            *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *puVar14;
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          puVar14 = puVar14 + 1;
        } while (puVar14 != puVar3);
      }
      pTVar4 = local_40;
      bVar5 = TrainerInterface::IsValidSentencePiece(&local_40->super_TrainerInterface,&local_68);
      pfVar1 = local_48;
      if (bVar5) {
        local_70 = (Symbol *)operator_new(0x70);
        p_Var10 = &(local_70->positions)._M_t._M_impl.super__Rb_tree_header;
        (local_70->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_70->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_70->left = (Symbol *)0x0;
        local_70->right = (Symbol *)0x0;
        (local_70->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_70->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(local_70->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_70->chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        local_70->fp = 0;
        local_70->freq = 0;
        (local_70->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var10->_M_header;
        (local_70->positions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var10->_M_header;
        (local_70->positions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __position._M_current =
             (pTVar4->allocated_).
             super__Vector_base<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pTVar4->allocated_).
            super__Vector_base<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<sentencepiece::bpe::Trainer::Symbol*,std::allocator<sentencepiece::bpe::Trainer::Symbol*>>
          ::_M_realloc_insert<sentencepiece::bpe::Trainer::Symbol*const&>
                    ((vector<sentencepiece::bpe::Trainer::Symbol*,std::allocator<sentencepiece::bpe::Trainer::Symbol*>>
                      *)&pTVar4->allocated_,__position,&local_70);
        }
        else {
          *__position._M_current = local_70;
          pppSVar2 = &(pTVar4->allocated_).
                      super__Vector_base<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppSVar2 = *pppSVar2 + 1;
        }
        local_70->fp = local_38;
        local_70->left = left;
        local_70->right = right;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&local_70->chars,&local_68);
        port::
        InsertOrDie<std::unordered_map<unsigned_long,sentencepiece::bpe::Trainer::Symbol*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,sentencepiece::bpe::Trainer::Symbol*>>>>
                  (pfVar1,&local_70->fp,&local_70);
        pSVar12 = local_70;
      }
      else {
        pSVar12 = (Symbol *)0x0;
      }
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      pSVar12 = *(Symbol **)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
                        ._M_cur + 0x10);
    }
  }
  return pSVar12;
}

Assistant:

Trainer::Symbol *Trainer::GetPairSymbol(const Symbol *left,
                                        const Symbol *right) {
  if (left == nullptr || right == nullptr || left->is_unk || right->is_unk) {
    return nullptr;
  }

  const uint64 fp = port::FingerprintCat(left->fp, right->fp);
  const auto it = symbols_cache_.find(fp);
  if (it != symbols_cache_.end()) {
    return it->second;
  }

  CHECK(!left->chars.empty());
  CHECK(!right->chars.empty());
  string_util::UnicodeText ut;
  for (const char32 c : left->chars) ut.push_back(c);
  for (const char32 c : right->chars) ut.push_back(c);

  // Do not make an invalid piece.
  if (!IsValidSentencePiece(ut)) {
    return nullptr;
  }

  Symbol *s = new Symbol;
  allocated_.push_back(s);
  s->fp = fp;
  s->left = left;
  s->right = right;
  s->chars = ut;
  port::InsertOrDie(&symbols_cache_, s->fp, s);
  return s;
}